

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeVLDST3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  undefined4 local_40;
  uint size;
  uint load;
  uint align;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,6,2);
  if (uVar1 == 3) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    uVar1 = fieldFromInstruction_4(Insn,4,2);
    if ((uVar1 & 2) == 0) {
      uVar1 = fieldFromInstruction_4(Insn,0x15,1);
      if (uVar1 == 0) {
        local_40 = DecodeVSTInstruction(Inst,Insn,Address,Decoder);
      }
      else {
        local_40 = DecodeVLDInstruction(Inst,Insn,Address,Decoder);
      }
      Inst_local._4_4_ = local_40;
    }
    else {
      Inst_local._4_4_ = MCDisassembler_Fail;
    }
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeVLDST3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	align = fieldFromInstruction_4(Insn, 4, 2);
	if (align & 2) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}